

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSort.cpp
# Opt level: O0

bool increasingSetOk(vector<double,_std::allocator<double>_> *set,double set_entry_lower,
                    double set_entry_upper,bool strict)

{
  double dVar1;
  size_type sVar2;
  const_reference pvVar3;
  byte in_SIL;
  vector<double,_std::allocator<double>_> *in_RDI;
  double in_XMM0_Qa;
  double in_XMM1_Qa;
  double entry;
  HighsInt k;
  double previous_entry;
  bool check_bounds;
  HighsInt set_num_entries;
  int local_3c;
  double local_38;
  
  sVar2 = std::vector<double,_std::allocator<double>_>::size(in_RDI);
  if (in_XMM0_Qa <= in_XMM1_Qa) {
    local_38 = in_XMM0_Qa;
    if ((in_SIL & 1) != 0) {
      if (0.0 <= in_XMM0_Qa) {
        if (in_XMM0_Qa <= 0.0) {
          local_38 = -1e-14;
        }
        else {
          local_38 = in_XMM0_Qa * 0.99999999999999;
        }
      }
      else {
        local_38 = in_XMM0_Qa * 1.00000000000001;
      }
    }
  }
  else {
    local_38 = -INFINITY;
  }
  local_3c = 0;
  while( true ) {
    if ((int)sVar2 <= local_3c) {
      return true;
    }
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](in_RDI,(long)local_3c);
    dVar1 = *pvVar3;
    if ((in_SIL & 1) == 0) {
      if (dVar1 < local_38) {
        return false;
      }
    }
    else if (dVar1 <= local_38) {
      return false;
    }
    if ((in_XMM0_Qa <= in_XMM1_Qa) && (in_XMM1_Qa < dVar1)) break;
    local_3c = local_3c + 1;
    local_38 = dVar1;
  }
  return false;
}

Assistant:

bool increasingSetOk(const vector<double>& set, const double set_entry_lower,
                     const double set_entry_upper, bool strict) {
  HighsInt set_num_entries = set.size();
  bool check_bounds = set_entry_lower <= set_entry_upper;
  double previous_entry;
  if (check_bounds) {
    if (strict) {
      if (set_entry_lower < 0) {
        previous_entry = (1 + kHighsTiny) * set_entry_lower;
      } else if (set_entry_lower > 0) {
        previous_entry = (1 - kHighsTiny) * set_entry_lower;
      } else {
        previous_entry = -kHighsTiny;
      }
    } else {
      previous_entry = set_entry_lower;
    }
  } else {
    previous_entry = -kHighsInf;
  }
  for (HighsInt k = 0; k < set_num_entries; k++) {
    double entry = set[k];
    if (strict) {
      if (entry <= previous_entry) return false;
    } else {
      if (entry < previous_entry) return false;
    }
    if (check_bounds && entry > set_entry_upper) return false;
    previous_entry = entry;
  }
  return true;
}